

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O0

_Bool progress_meter(GlobalConfig *global,curltime *start,_Bool final)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [12];
  bool bVar8;
  bool bVar9;
  curl_off_t cVar10;
  uint uVar11;
  FILE *pFVar12;
  timediff_t tVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  curltime cVar19;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  long local_160;
  long local_150;
  long local_138;
  curl_off_t left;
  curl_off_t est;
  curl_off_t uls;
  curl_off_t dls;
  curl_off_t ul;
  curl_off_t dl;
  timediff_t deltams;
  uint i;
  curl_off_t speed;
  curl_off_t all_running;
  _Bool ulknown;
  curl_off_t cStack_d0;
  _Bool dlknown;
  curl_off_t all_ulnow;
  curl_off_t all_dlnow;
  per_transfer *per;
  char ulpercen [4];
  char dlpercen [4];
  curl_off_t spent;
  char buffer [3] [6];
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  undefined4 uStack_6c;
  timediff_t diff;
  curltime now;
  _Bool final_local;
  curltime *start_local;
  GlobalConfig *global_local;
  
  if (((*(ushort *)&global->field_0x63 >> 9 & 1) == 0) &&
     ((*(ushort *)&global->field_0x63 >> 8 & 1) == 0)) {
    cVar19 = curlx_now();
    auVar7 = cVar19._0_12_;
    newer._12_4_ = 0;
    newer.tv_sec = auVar7._0_8_;
    newer.tv_usec = auVar7._8_4_;
    older.tv_usec = progress_meter::stamp.tv_usec;
    older.tv_sec = progress_meter::stamp.tv_sec;
    older._12_4_ = 0;
    tVar13 = curlx_timediff(newer,older);
    if ((progress_meter::header & 1U) == 0) {
      progress_meter::header = true;
      fputs("DL% UL%  Dled  Uled  Xfers  Live Total     Current  Left    Speed\n",
            (FILE *)tool_stderr);
    }
    if ((final) || (500 < tVar13)) {
      uVar1 = start->tv_sec;
      uVar2 = start->tv_usec;
      older_00.tv_usec = uVar2;
      older_00.tv_sec = uVar1;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar7._0_8_;
      newer_00.tv_usec = auVar7._8_4_;
      older_00._12_4_ = 0;
      tVar13 = curlx_timediff(newer_00,older_00);
      _ulpercen = tVar13 / 1000;
      per._4_4_ = 0x2d2d;
      per._0_4_ = 0x2d2d;
      bVar9 = true;
      bVar8 = true;
      speed = 0;
      progress_meter::stamp._12_4_ = uStack_6c;
      progress_meter::stamp.tv_usec = cVar19.tv_usec;
      all_ulnow = all_dlalready;
      cStack_d0 = all_ulalready;
      progress_meter::stamp.tv_sec = cVar19.tv_sec;
      for (all_dlnow = (curl_off_t)transfers; all_dlnow != 0; all_dlnow = *(curl_off_t *)all_dlnow)
      {
        all_ulnow = *(long *)(all_dlnow + 0x198) + all_ulnow;
        cStack_d0 = *(long *)(all_dlnow + 0x1a8) + cStack_d0;
        if (*(long *)(all_dlnow + 400) == 0) {
          bVar9 = false;
        }
        else if ((*(byte *)(all_dlnow + 0x1c0) & 1) == 0) {
          all_dltotal = *(long *)(all_dlnow + 400) + all_dltotal;
          *(byte *)(all_dlnow + 0x1c0) = *(byte *)(all_dlnow + 0x1c0) & 0xfe | 1;
        }
        if (*(long *)(all_dlnow + 0x1a0) == 0) {
          bVar8 = false;
        }
        else if ((*(byte *)(all_dlnow + 0x1c0) >> 1 & 1) == 0) {
          all_ultotal = *(long *)(all_dlnow + 0x1a0) + all_ultotal;
          *(byte *)(all_dlnow + 0x1c0) = *(byte *)(all_dlnow + 0x1c0) & 0xfd | 2;
        }
        if ((*(byte *)(all_dlnow + 0x1d8) >> 3 & 1) != 0) {
          speed = speed + 1;
        }
      }
      if ((bVar9) && (all_dltotal != 0)) {
        if (all_ulnow < 0x147ae147ae147ae) {
          local_138 = (all_ulnow * 100) / all_dltotal;
        }
        else {
          local_138 = all_ulnow / (all_dltotal / 100);
        }
        curl_msnprintf((long)&per + 4,4,"%3ld",local_138);
      }
      if ((bVar8) && (all_ultotal != 0)) {
        if (cStack_d0 < 0x147ae147ae147ae) {
          local_150 = (cStack_d0 * 100) / all_ultotal;
        }
        else {
          local_150 = cStack_d0 / (all_ultotal / 100);
        }
        curl_msnprintf(&per,4,"%3ld",local_150);
      }
      uVar11 = speedindex;
      speedstore[speedindex].dl = all_ulnow;
      speedstore[uVar11].ul = cStack_d0;
      speedstore[uVar11].stamp.tv_sec = cVar19.tv_sec;
      *(ulong *)&speedstore[uVar11].stamp.tv_usec = CONCAT44(uStack_6c,cVar19.tv_usec);
      speedindex = speedindex + 1;
      if (9 < speedindex) {
        indexwrapped = true;
        speedindex = 0;
      }
      if ((indexwrapped & 1U) == 0) {
        uVar5 = start->tv_sec;
        uVar6 = start->tv_usec;
        older_02.tv_usec = uVar6;
        older_02.tv_sec = uVar5;
        cVar19._12_4_ = 0;
        cVar19.tv_sec = auVar7._0_8_;
        cVar19.tv_usec = auVar7._8_4_;
        older_02._12_4_ = 0;
        dl = curlx_timediff(cVar19,older_02);
        ul = all_ulnow;
        dls = cStack_d0;
      }
      else {
        uVar3 = speedstore[speedindex].stamp.tv_sec;
        uVar4 = speedstore[speedindex].stamp.tv_usec;
        older_01.tv_usec = uVar4;
        older_01.tv_sec = uVar3;
        newer_01._12_4_ = 0;
        newer_01.tv_sec = auVar7._0_8_;
        newer_01.tv_usec = auVar7._8_4_;
        older_01._12_4_ = 0;
        dl = curlx_timediff(newer_01,older_01);
        ul = all_ulnow - speedstore[speedindex].dl;
        dls = cStack_d0 - speedstore[speedindex].ul;
      }
      if (dl == 0) {
        dl = 1;
      }
      lVar14 = (long)((double)ul / ((double)dl / 1000.0));
      local_160 = (long)((double)dls / ((double)dl / 1000.0));
      if (local_160 < lVar14) {
        local_160 = lVar14;
      }
      if ((bVar9) && (local_160 != 0)) {
        lVar14 = all_dltotal / local_160;
        time2str(time_total + 2,(all_dltotal - all_ulnow) / local_160);
        time2str(time_spent + 2,lVar14);
      }
      else {
        time2str(time_total + 2,0);
        time2str(time_spent + 2,0);
      }
      time2str(buffer[1] + 4,_ulpercen);
      pFVar12 = tool_stderr;
      pcVar15 = max5data(all_ulnow,(char *)&spent);
      pcVar16 = max5data(cStack_d0,(char *)((long)&spent + 6));
      cVar10 = all_xfers;
      pcVar17 = max5data(local_160,buffer[0] + 4);
      pcVar18 = "";
      if (final) {
        pcVar18 = "\n";
      }
      curl_mfprintf(pFVar12,"\r%-3s %-3s %s %s %5ld %5ld  %s %s %s %s %5s",(long)&per + 4,&per,
                    pcVar15,pcVar16,cVar10,speed,time_spent + 2,buffer[1] + 4,time_total + 2,pcVar17
                    ,pcVar18);
      global_local._7_1_ = true;
    }
    else {
      global_local._7_1_ = false;
    }
  }
  else {
    global_local._7_1_ = false;
  }
  return global_local._7_1_;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct curltime *start,
                    bool final)
{
  static struct curltime stamp;
  static bool header = FALSE;
  struct curltime now;
  timediff_t diff;

  if(global->noprogress || global->silent)
    return FALSE;

  now = curlx_now();
  diff = curlx_timediff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live "
          "Total     Current  Left    Speed\n",
          tool_stderr);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = curlx_timediff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(per->added)
        all_running++;
    }
    if(dlknown && all_dltotal)
      msnprintf(dlpercen, sizeof(dlpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_dlnow < (CURL_OFF_T_MAX/100) ?
                (all_dlnow * 100 / all_dltotal) :
                (all_dlnow / (all_dltotal/100)));

    if(ulknown && all_ultotal)
      msnprintf(ulpercen, sizeof(ulpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_ulnow < (CURL_OFF_T_MAX/100) ?
                (all_ulnow * 100 / all_ultotal) :
                (all_ulnow / (all_ultotal/100)));

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      timediff_t deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = curlx_timediff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = curlx_timediff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      if(!deltams) /* no division by zero please */
        deltams++;
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(tool_stderr,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            " %s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}